

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

ostream * tcu::operator<<(ostream *os,Interval *interval)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (interval->m_lo < interval->m_hi || interval->m_lo == interval->m_hi) {
    pcVar2 = "";
    if (interval->m_hasNaN != false) {
      pcVar2 = "~";
    }
    poVar1 = std::operator<<(os,pcVar2);
    std::operator<<(poVar1,"[");
    poVar1 = std::ostream::_M_insert<double>(interval->m_lo);
    std::operator<<(poVar1,", ");
    poVar1 = std::ostream::_M_insert<double>(interval->m_hi);
    pcVar2 = "]";
  }
  else {
    poVar1 = os;
    if (interval->m_hasNaN == false) {
      pcVar2 = "()";
    }
    else {
      pcVar2 = "[NaN]";
    }
  }
  std::operator<<(poVar1,pcVar2);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Interval& interval)
{
	if (interval.empty())
		if (interval.hasNaN())
			os << "[NaN]";
		else
			os << "()";
	else
		os << (interval.hasNaN() ? "~" : "")
		   << "[" << interval.lo() << ", " << interval.hi() << "]";
	return os;
}